

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O1

parser_map *
argagg::validate_definitions
          (parser_map *__return_storage_ptr__,
          vector<argagg::definition,_std::allocator<argagg::definition>_> *definitions)

{
  __node_base_ptr *pp_Var1;
  undefined1 *puVar2;
  pointer pdVar3;
  definition *pdVar4;
  pointer pcVar5;
  __node_base_ptr p_Var6;
  int iVar7;
  pointer pdVar8;
  size_t sVar9;
  char *pcVar10;
  const_iterator cVar11;
  ostream *poVar12;
  runtime_error *prVar13;
  char *pcVar14;
  pointer __k;
  undefined8 *puVar15;
  undefined1 local_220 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>_>
  long_map;
  ostringstream msg;
  string local_60 [32];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_40;
  pointer local_38;
  
  local_220 = (undefined1  [8])&long_map._M_h._M_rehash_policy._M_next_resize;
  long_map._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
  long_map._M_h._M_bucket_count = 0;
  long_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  long_map._M_h._M_element_count._0_4_ = 0x3f800000;
  long_map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  long_map._M_h._M_rehash_policy._4_4_ = 0;
  long_map._M_h._M_rehash_policy._M_next_resize = 0;
  memset(__return_storage_ptr__,0,0x838);
  local_40 = &(__return_storage_ptr__->long_map)._M_h;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(local_40,local_220);
  pdVar8 = (definitions->super__Vector_base<argagg::definition,_std::allocator<argagg::definition>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pdVar3 = (definitions->super__Vector_base<argagg::definition,_std::allocator<argagg::definition>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pdVar8 != pdVar3) {
    pp_Var1 = &long_map._M_h._M_single_bucket;
    do {
      __k = (pdVar8->flags).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      msg._368_8_ = (pdVar8->flags).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      local_38 = pdVar8;
      if ((pointer)msg._368_8_ == __k) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&long_map._M_h._M_single_bucket)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&long_map._M_h._M_single_bucket,"option \"",8);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&long_map._M_h._M_single_bucket,
                             (local_38->name)._M_dataplus._M_p,(local_38->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"\" has no flag definitions",0x19);
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar13,local_60);
        *(undefined ***)prVar13 = &PTR__runtime_error_00168a10;
        __cxa_throw(prVar13,&invalid_flag::typeinfo,std::runtime_error::~runtime_error);
      }
      do {
        pcVar14 = (__k->_M_dataplus)._M_p;
        sVar9 = strlen(pcVar14);
        p_Var6 = long_map._M_h._M_single_bucket;
        if ((sVar9 < 2) || (*pcVar14 != '-')) {
LAB_0010ba7e:
          std::__cxx11::ostringstream::ostringstream
                    ((ostringstream *)&long_map._M_h._M_single_bucket);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&long_map._M_h._M_single_bucket,"flag \"",6);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&long_map._M_h._M_single_bucket,(__k->_M_dataplus)._M_p,
                               __k->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"\" specified for option \"",0x18);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(local_38->name)._M_dataplus._M_p,
                               (local_38->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" is invalid",0xc);
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar13,local_60);
          *(undefined ***)prVar13 = &PTR__runtime_error_00168a10;
          __cxa_throw(prVar13,&invalid_flag::typeinfo,std::runtime_error::~runtime_error);
        }
        long_map._M_h._M_single_bucket =
             (__node_base_ptr)((ulong)long_map._M_h._M_single_bucket & 0xffffffffffffff00);
        if (pcVar14[1] == '-') {
          long_map._M_h._M_single_bucket = (__node_base_ptr)CONCAT71(SUB87(p_Var6,1),1);
          if (sVar9 == 2) goto LAB_0010ba7e;
          pcVar14 = pcVar14 + 2;
        }
        else {
          pcVar14 = pcVar14 + 1;
        }
        sVar9 = strlen(pcVar14);
        iVar7 = isalnum((int)*pcVar14);
        if ((iVar7 == 0) || (((char)long_map._M_h._M_single_bucket == '\0' && (1 < sVar9))))
        goto LAB_0010ba7e;
        pcVar10 = std::
                  __find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<argagg::is_valid_flag_definition(char_const*)::_lambda(char_const&)_1_>>
                            (pcVar14 + 1,pcVar14 + sVar9,pp_Var1);
        if (pcVar10 != pcVar14 + sVar9) goto LAB_0010ba7e;
        pcVar14 = (__k->_M_dataplus)._M_p;
        if (*pcVar14 == '-') {
          iVar7 = isalnum((int)pcVar14[1]);
          if (iVar7 == 0) goto LAB_0010b9d6;
          pdVar4 = (__return_storage_ptr__->short_map)._M_elems[pcVar14[1]];
          if (pdVar4 != (definition *)0x0) {
            std::__cxx11::ostringstream::ostringstream
                      ((ostringstream *)&long_map._M_h._M_single_bucket);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&long_map._M_h._M_single_bucket,"duplicate short flag \"",0x16);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&long_map._M_h._M_single_bucket,(__k->_M_dataplus)._M_p,
                                 __k->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"\" found, specified by both option  \"",0x24);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(local_38->name)._M_dataplus._M_p,
                                 (local_38->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" and option \"",0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,(pdVar4->name)._M_dataplus._M_p,(pdVar4->name)._M_string_length);
            prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar13,local_60);
            *(undefined ***)prVar13 = &PTR__runtime_error_00168a10;
            __cxa_throw(prVar13,&invalid_flag::typeinfo,std::runtime_error::~runtime_error);
          }
          (__return_storage_ptr__->short_map)._M_elems[pcVar14[1]] = local_38;
        }
        else {
LAB_0010b9d6:
          cVar11 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(local_40,__k);
          if (cVar11.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_true>
              ._M_cur != (__node_type *)0x0) {
            cVar11 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(local_40,__k);
            if (cVar11.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_true>
                ._M_cur == (__node_type *)0x0) {
              puVar15 = (undefined8 *)0x0;
            }
            else {
              puVar15 = *(undefined8 **)
                         ((long)cVar11.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_true>
                                ._M_cur + 0x28);
            }
            std::__cxx11::ostringstream::ostringstream
                      ((ostringstream *)&long_map._M_h._M_single_bucket);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&long_map._M_h._M_single_bucket,"duplicate long flag \"",0x15);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&long_map._M_h._M_single_bucket,(__k->_M_dataplus)._M_p,
                                 __k->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"\" found, specified by both option  \"",0x24);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(local_38->name)._M_dataplus._M_p,
                                 (local_38->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" and option \"",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)*puVar15,puVar15[1]);
            prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar13,local_60);
            *(undefined ***)prVar13 = &PTR__runtime_error_00168a10;
            __cxa_throw(prVar13,&invalid_flag::typeinfo,std::runtime_error::~runtime_error);
          }
          puVar2 = &msg.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
          pcVar5 = (__k->_M_dataplus)._M_p;
          long_map._M_h._M_single_bucket = (__node_base_ptr)puVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)pp_Var1,pcVar5,pcVar5 + __k->_M_string_length);
          msg.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = local_38;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,argagg::definition_const*>,std::allocator<std::pair<std::__cxx11::string_const,argagg::definition_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string,argagg::definition_const*>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,argagg::definition_const*>,std::allocator<std::pair<std::__cxx11::string_const,argagg::definition_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)local_40,pp_Var1);
          if (long_map._M_h._M_single_bucket != (__node_base_ptr)puVar2) {
            operator_delete(long_map._M_h._M_single_bucket,
                            msg.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ + 1);
          }
        }
        __k = __k + 1;
      } while (__k != (pointer)msg._368_8_);
      pdVar8 = local_38 + 1;
    } while (pdVar8 != pdVar3);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_220);
  return __return_storage_ptr__;
}

Assistant:

inline
parser_map validate_definitions(
  const std::vector<definition>& definitions)
{
  std::unordered_map<std::string, const definition*> long_map;
  parser_map map {{{nullptr}}, std::move(long_map)};

  for (auto& defn : definitions) {

    if (defn.flags.size() == 0) {
      std::ostringstream msg;
      msg << "option \"" << defn.name << "\" has no flag definitions";
      throw invalid_flag(msg.str());
    }

    for (auto& flag : defn.flags) {

      if (!is_valid_flag_definition(flag.data())) {
        std::ostringstream msg;
        msg << "flag \"" << flag << "\" specified for option \"" << defn.name
            << "\" is invalid";
        throw invalid_flag(msg.str());
      }

      if (flag_is_short(flag.data())) {
        const int short_flag_letter = flag[1];
        const auto existing_short_flag = map.short_map[short_flag_letter];
        bool short_flag_already_exists = (existing_short_flag != nullptr);
        if (short_flag_already_exists) {
          std::ostringstream msg;
          msg << "duplicate short flag \"" << flag
              << "\" found, specified by both option  \"" << defn.name
              << "\" and option \"" << existing_short_flag->name;
          throw invalid_flag(msg.str());
        }
        map.short_map[short_flag_letter] = &defn;
        continue;
      }

      // If we're here then this is a valid, long-style flag.
      if (map.known_long_flag(flag)) {
        const auto existing_long_flag = map.get_definition_for_long_flag(flag);
        std::ostringstream msg;
        msg << "duplicate long flag \"" << flag
            << "\" found, specified by both option  \"" << defn.name
            << "\" and option \"" << existing_long_flag->name;
        throw invalid_flag(msg.str());
      }
      map.long_map.insert(std::make_pair(flag, &defn));
    }
  }

  return map;
}